

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O1

void __thiscall
sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::
connect<cursespp::ListOverlay>
          (signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local> *this,
          ListOverlay *pclass,offset_in_ListOverlay_to_subr pmemfun)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *in_RCX;
  
  (*(this->super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  p_Var2 = (_List_node_base *)operator_new(0x20);
  p_Var2->_M_next = (_List_node_base *)&PTR___connection2_001a96a8;
  p_Var2->_M_prev = (_List_node_base *)pclass;
  p_Var2[1]._M_next = (_List_node_base *)pmemfun;
  p_Var2[1]._M_prev = in_RCX;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->
            super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
            ).m_connected_slots.
            super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  has_slots<sigslot::multi_threaded_local>::signal_connect
            (&pclass->super_has_slots<sigslot::multi_threaded_local>,
             (_signal_base<sigslot::multi_threaded_local> *)this);
  (*(this->super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[3])(this);
  return;
}

Assistant:

void connect(desttype* pclass, void (desttype::*pmemfun)(arg1_type,
			arg2_type))
		{
			lock_block<mt_policy> lock(this);
			_connection2<desttype, arg1_type, arg2_type, mt_policy>* conn = new
				_connection2<desttype, arg1_type, arg2_type, mt_policy>(pclass, pmemfun);
			this->m_connected_slots.push_back(conn);
			pclass->signal_connect(this);
		}